

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O2

int AF_A_FirePhoenixPL2(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  undefined1 *puVar1;
  VM_UBYTE VVar2;
  DObject *this;
  player_t *player;
  AWeapon *this_00;
  double dVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  AActor *this_01;
  FState *state;
  AActor *actor;
  char *__assertion;
  double dVar8;
  FSoundID local_4c;
  FName local_48;
  FName local_44;
  DVector3 pos;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0052df5c;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0052df4c;
  actor = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (actor == (AActor *)0x0) goto LAB_0052dce4;
    bVar4 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
    if (!bVar4) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0052df5c;
    }
  }
  else {
    if (actor != (AActor *)0x0) goto LAB_0052df4c;
LAB_0052dce4:
    actor = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_0052dd64;
  VVar2 = param[1].field_0.field_3.Type;
  if (VVar2 != 0xff) {
    if (VVar2 != '\x03') {
LAB_0052df4c:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_0052df5c;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar4 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar4)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0052df5c;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_0052df4c;
  }
  if ((((uint)numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
     ((VVar2 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0052dd64:
    player = actor->player;
    if (player == (player_t *)0x0) {
      return 0;
    }
    iVar5 = S_FindSound("weapons/phoenixpowshoot");
    this_00 = player->ReadyWeapon;
    if (this_00 != (AWeapon *)0x0) {
      puVar1 = &this_00->field_0x584;
      *(int *)puVar1 = *(int *)puVar1 + -1;
      if (*(int *)puVar1 != 0) {
        dVar8 = TAngle<double>::TanClamped(&(actor->Angles).Pitch,5.0);
        iVar6 = FRandom::Random2(&pr_fp2);
        iVar7 = FRandom::Random2(&pr_fp2);
        AActor::Vec3Offset(&pos,actor,(double)iVar6 * 0.0078125,(double)iVar7 * 0.0078125,
                           (26.0 - dVar8) - actor->Floorclip,false);
        FName::FName(&local_48,"PhoenixFX2");
        this_01 = Spawn(&local_48,&pos,ALLOW_REPLACE);
        (this_01->target).field_0.p = actor;
        (this_01->Angles).Yaw.Degrees = (actor->Angles).Yaw.Degrees;
        AActor::VelFromAngle(this_01);
        dVar3 = (actor->Vel).Y;
        (this_01->Vel).X = (this_01->Vel).X + (actor->Vel).X;
        (this_01->Vel).Y = (this_01->Vel).Y + dVar3;
        (this_01->Vel).Z = (0.1 - dVar8) * this_01->Speed;
        if ((player->refire == 0) || (bVar4 = S_IsActorPlayingSomething(actor,1,-1), !bVar4)) {
          local_4c.ID = iVar5;
          S_Sound(actor,0x101,&local_4c,1.0,1.0);
        }
        P_CheckMissileSpawn(this_01,actor->radius);
        return 0;
      }
    }
    FName::FName(&local_44,"Powerdown");
    state = AActor::FindState((AActor *)this_00,&local_44);
    P_SetPsprite(player,PSP_WEAPON,state,false);
    player->refire = 0;
    S_StopSound(actor,1);
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_0052df5c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                ,0x50e,"int AF_A_FirePhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FirePhoenixPL2)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;

	double slope;
	FSoundID soundid;
	player_t *player;
	APhoenixRod *flamethrower;

	if (nullptr == (player = self->player))
	{
		return 0;
	}

	soundid = "weapons/phoenixpowshoot";

	flamethrower = static_cast<APhoenixRod *> (player->ReadyWeapon);
	if (flamethrower == nullptr || --flamethrower->FlameCount == 0)
	{ // Out of flame
		P_SetPsprite(player, PSP_WEAPON, flamethrower->FindState("Powerdown"));
		player->refire = 0;
		S_StopSound (self, CHAN_WEAPON);
		return 0;
	}

	slope = -self->Angles.Pitch.TanClamped();
	double xo = pr_fp2.Random2() / 128.;
	double yo = pr_fp2.Random2() / 128.;
	DVector3 pos = self->Vec3Offset(xo, yo, 26 + slope - self->Floorclip);

	slope += 0.1;
	mo = Spawn("PhoenixFX2", pos, ALLOW_REPLACE);
	mo->target = self;
	mo->Angles.Yaw = self->Angles.Yaw;
	mo->VelFromAngle();
	mo->Vel += self->Vel.XY();
	mo->Vel.Z = mo->Speed * slope;
	if (!player->refire || !S_IsActorPlayingSomething (self, CHAN_WEAPON, -1))
	{
		S_Sound (self, CHAN_WEAPON|CHAN_LOOP, soundid, 1, ATTN_NORM);
	}	
	P_CheckMissileSpawn (mo, self->radius);
	return 0;
}